

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeGetNumRelaxSolveFails(void *arkode_mem,long *fails)

{
  undefined8 *in_RSI;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkRelaxAccessMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffc8,(ARKodeRelaxMem *)0x18fd49);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8->step_supports_relaxation == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x30,0x2cc,"ARKodeGetNumRelaxSolveFails",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
      local_4 = -0x30;
    }
    else {
      *in_RSI = *(undefined8 *)(in_stack_ffffffffffffffd0 + 0xb8);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeGetNumRelaxSolveFails(void* arkode_mem, long int* fails)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  *fails = relax_mem->nls_fails;

  return ARK_SUCCESS;
}